

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void print_help(void)

{
  fprintf(_stderr,"%s\n","Git commit: 8bf34aaf Timestamp: 2025-04-26T20:40:39");
  fwrite("Usage: spirv-cross <...>\n\nBasic:\n\t[SPIR-V file] (- is stdin)\n\t[--output <output path>]: If not provided, prints output to stdout.\n\t[--dump-resources]:\n\t\tPrints a basic reflection of the SPIR-V module along with other output.\n\t[--help]:\n\t\tPrints this help message.\n"
         ,0x108,1,_stderr);
  fwrite("\nSelect backend:\n\tBy default, OpenGL-style GLSL is the target, with #version and GLSL/ESSL information inherited from the SPIR-V module if present.\n\t[--vulkan-semantics] or [-V]:\n\t\tEmit Vulkan GLSL instead of plain GLSL. Makes use of Vulkan-only features to match SPIR-V.\n\t[--msl]:\n\t\tEmit Metal Shading Language (MSL).\n\t[--hlsl]:\n\t\tEmit HLSL.\n\t[--reflect]:\n\t\tEmit JSON reflection.\n\t[--cpp]:\n\t\tDEPRECATED. Emits C++ code.\n"
         ,0x1a5,1,_stderr);
  fwrite("\nCommon options:\n\t[--entry name]:\n\t\tUse a specific entry point. By default, the first entry point in the module is used.\n\t[--stage <stage (vert, frag, geom, tesc, tese, comp)>]:\n\t\tForces use of a certain shader stage.\n\t\tCan disambiguate the entry point if more than one entry point exists with same name, but different stage.\n\t[--emit-line-directives]:\n\t\tIf SPIR-V has OpLine directives, aim to emit those accurately in output code as well.\n\t[--rename-entry-point <old> <new> <stage>]:\n\t\tRenames an entry point from what is declared in SPIR-V to code output.\n\t\tMostly relevant for HLSL or MSL.\n\t[--rename-interface-variable <in|out> <location> <new_variable_name>]:\n\t\tRename an interface variable based on location decoration.\n\t[--force-zero-initialized-variables]:\n\t\tForces temporary variables to be initialized to zero.\n\t\tCan be useful in environments where compilers do not allow potentially uninitialized variables.\n\t\tThis usually comes up with Phi temporaries.\n\t[--fixup-clipspace]:\n\t\tFixup Z clip-space at the end of a vertex shader. The behavior is backend-dependent.\n\t\tGLSL: Rewrites [0, w] Z range (D3D/Metal/Vulkan) to GL-style [-w, w].\n\t\tHLSL/MSL: Rewrites [-w, w] Z range (GL) to D3D/Metal/Vulkan-style [0, w].\n\t[--flip-vert-y]:\n\t\tInverts gl_Position.y (or equivalent) at the end of a vertex shader. This is equivalent to using negative viewport height.\n\t[--mask-stage-output-location <location> <component>]:\n\t\tIf a stage output variable with matching location and component is active, optimize away the variable if applicable.\n\t[--mask-stage-output-builtin <Position|PointSize|ClipDistance|CullDistance>]:\n\t\tIf a stage output variable with matching builtin is active, optimize away the variable if it can affect cross-stage linking correctness.\n\t[--relax-nan-checks]:\n\t\tRelax NaN checks for N{Clamp,Min,Max} and ordered vs. unordered compare instructions.\n"
         ,0x74e,1,_stderr);
  fwrite("\nGLSL options:\n\t[--es]:\n\t\tForce ESSL.\n\t[--no-es]:\n\t\tForce desktop GLSL.\n\t[--version <GLSL version>]:\n\t\tE.g. --version 450 will emit \'#version 450\' in shader.\n\t\tCode generation will depend on the version used.\n\t[--flatten-ubo]:\n\t\tEmit UBOs as plain uniform arrays which are suitable for use with glUniform4*v().\n\t\tThis can be an optimization on GL implementations where this is faster or works around buggy driver implementations.\n\t\tE.g.: uniform MyUBO { vec4 a; float b, c, d, e; }; will be emitted as uniform vec4 MyUBO[2];\n\t\tCaveat: You cannot mix and match floating-point and integer in the same UBO with this option.\n\t\tLegacy GLSL/ESSL (where this flattening makes sense) does not support bit-casting, which would have been the obvious workaround.\n\t[--extension ext]:\n\t\tAdd #extension string of your choosing to GLSL output.\n\t\tUseful if you use variable name remapping to something that requires an extension unknown to SPIRV-Cross.\n\t[--remove-unused-variables]:\n\t\tDo not emit interface variables which are not statically accessed by the shader.\n\t[--separate-shader-objects]:\n\t\tRedeclare gl_PerVertex blocks to be suitable for desktop GL separate shader objects.\n\t[--glsl-emit-push-constant-as-ubo]:\n\t\tInstead of a plain uniform of struct for push constants, emit a UBO block instead.\n\t[--glsl-emit-ubo-as-plain-uniforms]:\n\t\tInstead of emitting UBOs, emit them as plain uniform structs.\n\t[--glsl-remap-ext-framebuffer-fetch input-attachment color-location]:\n\t\tRemaps an input attachment to use GL_EXT_shader_framebuffer_fetch.\n\t\tgl_LastFragData[location] is read from. The attachment to read from must be declared as an output in the shader.\n\t[--glsl-ext-framebuffer-fetch-noncoherent]:\n\t\tUses noncoherent qualifier for framebuffer fetch.\n\t[--vulkan-glsl-disable-ext-samplerless-texture-functions]:\n\t\tDo not allow use of GL_EXT_samperless_texture_functions, even in Vulkan GLSL.\n\t\tUse of texelFetch and similar might have to create dummy samplers to work around it.\n\t[--combined-samplers-inherit-bindings]:\n\t\tInherit binding information from th..." /* TRUNCATED STRING LITERAL */
         ,0xf2f,1,_stderr);
  fwrite("\nMSL options:\n\t[--msl-version <MMmmpp>]:\n\t\tUses a specific MSL version, e.g. --msl-version 20100 for MSL 2.1.\n\t[--msl-capture-output]:\n\t\tWrites geometry varyings to a buffer instead of as stage-outputs.\n\t[--msl-swizzle-texture-samples]:\n\t\tWorks around lack of support for VkImageView component swizzles.\n\t\tThis has a massive impact on performance and bloat. Do not use this unless you are absolutely forced to.\n\t\tTo use this feature, the API side must pass down swizzle buffers.\n\t\tShould only be used by translation layers as a last resort.\n\t\tRecent Metal versions do not require this workaround.\n\t[--msl-ios]:\n\t\tTarget iOS Metal instead of macOS Metal.\n\t[--msl-pad-fragment-output]:\n\t\tAlways emit color outputs as 4-component variables.\n\t\tIn Metal, the fragment shader must emit at least as many components as the render target format.\n\t[--msl-domain-lower-left]:\n\t\tUse a lower-left tessellation domain.\n\t[--msl-argument-buffers]:\n\t\tEmit Indirect Argument buffers instead of plain bindings.\n\t\tRequires MSL 2.0 to be enabled.\n\t[--msl-texture-buffer-native]:\n\t\tEnable native support for texel buffers. Otherwise, it is emulated as a normal texture.\n\t[--msl-framebuffer-fetch]:\n\t\tImplement subpass inputs with frame buffer fetch.\n\t\tEmits [[color(N)]] inputs in fragment stage.\n\t\tRequires an Apple GPU.\n\t[--msl-emulate-cube-array]:\n\t\tEmulate cube arrays with 2D array and manual math.\n\t[--msl-discrete-descriptor-set <index>]:\n\t\tWhen using argument buffers, forces a specific descriptor set to be implemented without argument buffers.\n\t\tUseful for implementing push descriptors in emulation layers.\n\t\tCan be used multiple times for each descriptor set in question.\n\t[--msl-device-argument-buffer <descriptor set index>]:\n\t\tUse device address space to hold indirect argument buffers instead of constant.\n\t\tComes up when trying to support argument buffers which are larger than 64 KiB.\n\t[--msl-multiview]:\n\t\tEnable SPV_KHR_multiview emulation.\n\t[--msl-multiview-no-layered-rendering]:\n\t\tDon\'t set [[render_target_array_index]] in multiview shaders.\n\t\tUs..." /* TRUNCATED STRING LITERAL */
         ,0x24e6,1,_stderr);
  fwrite("\nHLSL options:\n\t[--shader-model]:\n\t\tEnables a specific shader model, e.g. --shader-model 50 for SM 5.0.\n\t[--flatten-ubo]:\n\t\tEmit UBOs as plain uniform arrays.\n\t\tE.g.: uniform MyUBO { vec4 a; float b, c, d, e; }; will be emitted as uniform float4 MyUBO[2];\n\t\tCaveat: You cannot mix and match floating-point and integer in the same UBO with this option.\n\t[--hlsl-enable-compat]:\n\t\tAllow point size and point coord to be used, even if they won\'t work as expected.\n\t\tPointSize is ignored, and PointCoord returns (0.5, 0.5).\n\t[--hlsl-support-nonzero-basevertex-baseinstance]:\n\t\tSupport base vertex and base instance by emitting a special cbuffer declared as:\n\t\tcbuffer SPIRV_Cross_VertexInfo { int SPIRV_Cross_BaseVertex; int SPIRV_Cross_BaseInstance; };\n\t[--hlsl-basevertex-baseinstance-binding <register index> <register space>]:\n\t\tAssign a fixed binding to SPIRV_Cross_VertexInfo.\n\t[--hlsl-auto-binding (push, cbv, srv, uav, sampler, all)]\n\t\tDo not emit any : register(#) bindings for specific resource types, and rely on HLSL compiler to assign something.\n\t[--hlsl-force-storage-buffer-as-uav]:\n\t\tAlways emit SSBOs as UAVs, even when marked as read-only.\n\t\tNormally, SSBOs marked with NonWritable will be emitted as SRVs.\n\t[--hlsl-nonwritable-uav-texture-as-srv]:\n\t\tEmit NonWritable storage images as SRV textures instead of UAV.\n\t\tUsing this option messes with the type system. SPIRV-Cross cannot guarantee that this will work.\n\t\tOne major problem area with this feature is function arguments, where we won\'t know if we\'re seeing a UAV or SRV.\n\t\tShader must ensure that read/write state is consistent at all call sites.\n\t[--set-hlsl-vertex-input-semantic <location> <semantic>]:\n\t\tEmits a specific vertex input semantic for a given location.\n\t\tOtherwise, TEXCOORD# is used as semantics, where # is location.\n\t[--set-hlsl-named-vertex-input-semantic <name> <semantic>]:\n\t\tEmits a specific vertex input semantic for a given name.\n\t\tOpName reflection information must be intact.\n\t[--hlsl-enable-16bit-types]:\n\t\tEnables native use of half/int16_t/uint1..." /* TRUNCATED STRING LITERAL */
         ,0x911,1,_stderr);
  fwrite("\nObscure options:\n\tThese options are not meant to be used on a regular basis. They have some occasional uses in the test suite.\n\t[--force-temporary]:\n\t\tAggressively emit temporary expressions instead of forwarding expressions. Very rarely used and under-tested.\n\t[--revision]:\n\t\tPrints build timestamp and Git commit information (updated when cmake is configured).\n\t[--iterations iter]:\n\t\tRecompiles the same shader over and over, benchmarking related.\n\t[--disable-storage-image-qualifier-deduction]:\n\t\tIf storage images are received without any nonwritable or nonreadable information,\n\t\tdo not attempt to analyze usage, and always emit read/write state.\n\t[--flatten-multidimensional-arrays]:\n\t\tDo not support multi-dimensional arrays and flatten them to one dimension.\n\t[--cpp-interface-name <name>]:\n\t\tEmit a specific class name in C++ codegen.\n\t[--force-recompile-max-debug-iterations <count>]:\n\t\tAllow compilation loop to run for N loops.\n\t\tCan be used to triage workarounds, but should not be used as a crutch, since it masks an implementation bug.\n"
         ,0x41e,1,_stderr);
  return;
}

Assistant:

static void print_version()
{
#ifdef HAVE_SPIRV_CROSS_GIT_VERSION
	fprintf(stderr, "%s\n", SPIRV_CROSS_GIT_REVISION);
#else
	fprintf(stderr, "Git revision unknown. Build with CMake to create timestamp and revision info.\n");
#endif
}